

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

QString * __thiscall QAccessibleMenuItem::text(QAccessibleMenuItem *this,Text t)

{
  ulong uVar1;
  int in_EDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *str;
  QKeySequence key;
  QString *in_stack_ffffffffffffff38;
  QString *text;
  QString *in_stack_ffffffffffffff78;
  undefined1 local_58 [24];
  undefined1 *local_40 [7];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  text = in_RDI;
  QString::QString((QString *)0x7dbd53);
  if (in_EDX == 0) {
    QAction::text();
    qt_accStripAmp(in_stack_ffffffffffffff78);
    QString::operator=(in_RDI,in_stack_ffffffffffffff38);
    QString::~QString((QString *)0x7dbdb9);
    QString::~QString((QString *)0x7dbdc6);
  }
  else if (in_EDX == 4) {
    local_40[0] = &DAT_aaaaaaaaaaaaaaaa;
    QAction::shortcut();
    uVar1 = QKeySequence::isEmpty();
    if ((uVar1 & 1) == 0) {
      QKeySequence::toString((SequenceFormat)local_58);
      QString::operator=(in_RDI,in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x7dbe31);
    }
    else {
      QAction::text();
      qt_accHotKey(text);
      QString::operator=(in_RDI,in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x7dbe6e);
      QString::~QString((QString *)0x7dbe78);
    }
    QKeySequence::~QKeySequence((QKeySequence *)local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return text;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleMenuItem::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Name:
        str = qt_accStripAmp(m_action->text());
        break;
    case QAccessible::Accelerator: {
#ifndef QT_NO_SHORTCUT
        QKeySequence key = m_action->shortcut();
        if (!key.isEmpty()) {
            str = key.toString();
        } else
#endif
        {
            str = qt_accHotKey(m_action->text());
        }
        break;
    }
    default:
        break;
    }
    return str;
}